

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spng.c
# Opt level: O2

int spng__inflate_stream
              (spng_ctx *ctx,char **out,size_t *len,size_t extra,void *start_buf,size_t start_len)

{
  uint uVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  Bytef *pBVar5;
  char *pcVar6;
  uInt uVar7;
  ulong uVar8;
  uint32_t bytes;
  size_t bytes_00;
  Bytef *local_58;
  ulong local_50;
  
  iVar3 = spng__inflate_init(ctx,0xf);
  if (iVar3 == 0) {
    uVar8 = ctx->chunk_cache_limit - ctx->chunk_cache_usage;
    if (ctx->max_chunk_size < uVar8) {
      uVar8 = ctx->max_chunk_size;
    }
    if (uVar8 < extra) {
      iVar3 = 0x4d;
    }
    else {
      local_50 = 0x2000;
      local_58 = (Bytef *)(*(ctx->alloc).malloc_fn)(0x2000);
      if (local_58 == (Bytef *)0x0) {
        iVar3 = 2;
      }
      else {
        uVar7 = (uInt)start_len;
        pBVar5 = (Bytef *)start_buf;
        if (start_len == 0) {
          pBVar5 = (Bytef *)0x0;
          uVar7 = 0;
        }
        if (start_buf == (void *)0x0) {
          uVar7 = 0;
        }
        (ctx->zstream).avail_in = uVar7;
        (ctx->zstream).next_in = pBVar5;
        (ctx->zstream).avail_out = 0x2000;
        (ctx->zstream).next_out = local_58;
        iVar2 = 2;
        while ((iVar4 = inflate(&ctx->zstream,0), iVar3 = iVar2, iVar4 == -5 || (iVar4 == 0))) {
          if ((ctx->zstream).avail_out == 0) {
            if (uVar8 - extra >> 1 < local_50) {
              iVar3 = 0x4d;
              goto LAB_0010a1e9;
            }
            pBVar5 = (Bytef *)(*(ctx->alloc).realloc_fn)(local_58,local_50 * 2);
            if (pBVar5 == (Bytef *)0x0) goto LAB_0010a1e9;
            (ctx->zstream).avail_out = (uint)local_50 & 0x7fffffff;
            (ctx->zstream).next_out = pBVar5 + local_50;
            local_50 = local_50 * 2;
            local_58 = pBVar5;
          }
          else if ((ctx->zstream).avail_in == 0) {
            uVar1 = ctx->cur_chunk_bytes_left;
            bytes = 0x2000;
            if (uVar1 < 0x2000) {
              bytes = uVar1;
            }
            if ((*(ushort *)&ctx->field_0xcc & 1) == 0) {
              bytes = uVar1;
            }
            iVar3 = read_chunk_bytes(ctx,bytes);
            if (iVar3 != 0) {
              if (bytes == 0) {
                iVar3 = 0x40;
              }
              goto LAB_0010a1e9;
            }
            (ctx->zstream).avail_in = bytes;
            (ctx->zstream).next_in = ctx->data;
          }
        }
        if ((iVar4 == 1) && (uVar8 = (ctx->zstream).total_out, uVar8 != 0)) {
          bytes_00 = uVar8 + extra;
          if ((!CARRY8(uVar8,extra)) &&
             (pcVar6 = (char *)(*(ctx->alloc).realloc_fn)(local_58,bytes_00), pcVar6 != (char *)0x0)
             ) {
            increase_cache_usage(ctx,bytes_00,0);
            *out = pcVar6;
            *len = bytes_00;
            return 0;
          }
        }
        else {
          iVar3 = 0x40;
        }
LAB_0010a1e9:
        (*(ctx->alloc).free_fn)(local_58);
      }
    }
  }
  return iVar3;
}

Assistant:

static int spng__inflate_stream(spng_ctx *ctx, char **out, size_t *len, size_t extra, const void *start_buf, size_t start_len)
{
    int ret = spng__inflate_init(ctx, 15);
    if(ret) return ret;

    size_t max = ctx->chunk_cache_limit - ctx->chunk_cache_usage;

    if(ctx->max_chunk_size < max) max = ctx->max_chunk_size;

    if(extra > max) return SPNG_ECHUNK_LIMITS;
    max -= extra;

    uint32_t read_size;
    size_t size = 8 * 1024;
    void *t, *buf = spng__malloc(ctx, size);

    if(buf == NULL) return SPNG_EMEM;

    z_stream *stream = &ctx->zstream;

    if(start_buf != NULL && start_len)
    {
        stream->avail_in = (uInt)start_len;
        stream->next_in = start_buf;
    }
    else
    {
        stream->avail_in = 0;
        stream->next_in = NULL;
    }

    stream->avail_out = (uInt)size;
    stream->next_out = buf;

    while(ret != Z_STREAM_END)
    {
        ret = inflate(stream, Z_NO_FLUSH);

        if(ret == Z_STREAM_END) break;

        if(ret != Z_OK && ret != Z_BUF_ERROR)
        {
            ret = SPNG_EZLIB;
            goto err;
        }

        if(!stream->avail_out) /* Resize buffer */
        {
            /* overflow or reached chunk/cache limit */
            if( (2 > SIZE_MAX / size) || (size > max / 2) )
            {
                ret = SPNG_ECHUNK_LIMITS;
                goto err;
            }

            size *= 2;

            t = spng__realloc(ctx, buf, size);
            if(t == NULL) goto mem;

            buf = t;

            stream->avail_out = (uInt)size / 2;
            stream->next_out = (unsigned char*)buf + size / 2;
        }
        else if(!stream->avail_in) /* Read more chunk bytes */
        {
            read_size = ctx->cur_chunk_bytes_left;
            if(ctx->streaming && read_size > SPNG_READ_SIZE) read_size = SPNG_READ_SIZE;

            ret = read_chunk_bytes(ctx, read_size);

            if(ret)
            {
                if(!read_size) ret = SPNG_EZLIB;

                goto err;
            }

            stream->avail_in = read_size;
            stream->next_in = ctx->data;
        }
    }

    size = stream->total_out;

    if(!size)
    {
        ret = SPNG_EZLIB;
        goto err;
    }

    size += extra;
    if(size < extra) goto mem;

    t = spng__realloc(ctx, buf, size);
    if(t == NULL) goto mem;

    buf = t;

    (void)increase_cache_usage(ctx, size, 0);

    *out = buf;
    *len = size;

    return 0;

mem:
    ret = SPNG_EMEM;
err:
    spng__free(ctx, buf);
    return ret;
}